

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-solver.cc
# Opt level: O1

void __thiscall
mp::NLFeeder_Easy::
FeedObjGradient<mp::NLWriter2<mp::NLWriter2Params<mp::TextFormatter,mp::NLFeeder_Easy>>::SingleSparseVecWrtFactory<int,double>>
          (NLFeeder_Easy *this,int param_1,SingleSparseVecWrtFactory<int,_double> *svwf)

{
  double *pdVar1;
  ulong uVar2;
  double dVar3;
  SparseVectorWriter<int,_double> svw;
  NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_mp::NLFeeder_Easy>_> *local_30;
  char *local_28;
  
  if (((this->header_).super_NLProblemInfo.super_NLProblemInfo_C.num_obj_nonzeros != 0) &&
     (NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_mp::NLFeeder_Easy>_>::
      SingleSparseVecWrtFactory<int,_double>::MakeVectorWriter
                ((SingleSparseVecWrtFactory<int,_double> *)&stack0xffffffffffffffd0,(size_t)svwf),
     0 < (this->header_).super_NLProblemInfo.super_NLProblemInfo_C.num_vars)) {
    pdVar1 = (this->nlme_).obj_c_;
    uVar2 = 0;
    do {
      if (((this->obj_grad_supp_).super__Bvector_base<std::allocator<bool>_>._M_impl.
           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar2 >> 6] >>
           (uVar2 & 0x3f) & 1) != 0) {
        if (pdVar1 == (double *)0x0) {
          dVar3 = 0.0;
        }
        else {
          dVar3 = pdVar1[uVar2];
        }
        local_28 = local_28 + -1;
        TextFormatter::apr(&local_30->super_FormatterType,&local_30->nm,"%d %g\n",dVar3,
                           (ulong)(uint)(this->var_perm_).
                                        super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start[uVar2].first);
      }
      uVar2 = uVar2 + 1;
    } while ((long)uVar2 < (long)(this->header_).super_NLProblemInfo.super_NLProblemInfo_C.num_vars)
    ;
  }
  return;
}

Assistant:

void FeedObjGradient(int , ObjGradWriterFactory& svwf) {
    if (header_.num_obj_nonzeros) {
      auto svw = svwf.MakeVectorWriter(header_.num_obj_nonzeros);
      auto c = NLME().ObjCoefficients();
      for (int j=0; j<header_.num_vars; ++j)
        if (obj_grad_supp_[j])
          svw.Write(VPerm(j), c ? c[j] : 0.0);
    }
  }